

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * strAccumFinishRealloc(StrAccum *p)

{
  char *__dest;
  
  __dest = (char *)sqlite3DbMallocRaw(p->db,(ulong)(p->nChar + 1));
  if (__dest == (char *)0x0) {
    p->accError = '\a';
    p->nAlloc = 0;
  }
  else {
    memcpy(__dest,p->zText,(ulong)(p->nChar + 1));
    p->printfFlags = p->printfFlags | 4;
  }
  p->zText = __dest;
  return __dest;
}

Assistant:

static SQLITE_NOINLINE char *strAccumFinishRealloc(StrAccum *p){
  char *zText;
  assert( p->mxAlloc>0 && !isMalloced(p) );
  zText = sqlite3DbMallocRaw(p->db, p->nChar+1 );
  if( zText ){
    memcpy(zText, p->zText, p->nChar+1);
    p->printfFlags |= SQLITE_PRINTF_MALLOCED;
  }else{
    setStrAccumError(p, SQLITE_NOMEM);
  }
  p->zText = zText;
  return zText;
}